

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

void check_leaf_list_backlinks(lyd_node *node,int op)

{
  lys_node *plVar1;
  lys_node *plVar2;
  LYS_NODE LVar3;
  ly_set *set;
  lyd_node *data;
  LY_ERR *pLVar4;
  ulong uVar5;
  ushort uVar6;
  ulong uVar7;
  lyd_node *plVar8;
  
  plVar8 = node;
  if (2 < (uint)op) {
    __assert_fail("(op == 0) || (op == 1) || (op == 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x2ff,"void check_leaf_list_backlinks(struct lyd_node *, int)");
  }
  do {
    data = plVar8;
    if (data == (lyd_node *)0x0) {
LAB_001565ad:
      if (node->parent != (lyd_node *)0x0) {
        node->parent->validity = '\x02';
      }
      lyd_wd_update_parents(node);
      return;
    }
    LVar3 = data->schema->nodetype;
    if (((LVar3 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
       (plVar1 = data->schema->child, plVar1 != (lys_node *)0x0)) {
      for (uVar7 = 0; uVar7 < *(uint *)((long)&plVar1->name + 4); uVar7 = uVar7 + 1) {
        set = lyd_find_instance(data,*(lys_node **)(plVar1->dsc + uVar7 * 8));
        if (set == (ly_set *)0x0) {
          pLVar4 = ly_errno_location();
          *pLVar4 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                 ,0x317);
          return;
        }
        for (uVar5 = 0; uVar5 < set->number; uVar5 = uVar5 + 1) {
          plVar2 = (set->set).s[uVar5];
          uVar6 = *(ushort *)&plVar2->parent;
          if (op == 0) {
            if ((uVar6 & 0x40) != 0) goto LAB_0015650f;
          }
          else {
            if ((uVar6 == 9) && (*(lyd_node **)&plVar2->nodetype == data)) {
              uVar6 = 9;
            }
            else if ((op == 1) || ((uVar6 & 0x40) == 0)) goto LAB_0015651e;
LAB_0015650f:
            *(byte *)&plVar2->dsc = *(byte *)&plVar2->dsc | 4;
            if (uVar6 == 9) {
              *(undefined8 *)&plVar2->nodetype = 0;
            }
          }
LAB_0015651e:
        }
        ly_set_free(set);
      }
      LVar3 = data->schema->nodetype;
    }
    if (((LVar3 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) ||
       (plVar8 = data->child, plVar8 == (lyd_node *)0x0)) {
      if (data != node) goto LAB_00156558;
      goto LAB_001565ad;
    }
    while ((plVar8 == (lyd_node *)0x0 && (data = data->parent, data->parent != node->parent))) {
LAB_00156558:
      plVar8 = data->next;
    }
  } while( true );
}

Assistant:

static void
check_leaf_list_backlinks(struct lyd_node *node, int op)
{
    struct lyd_node *next, *iter;
    struct lyd_node_leaf_list *leaf_list;
    struct ly_set *set, *data;
    uint32_t i, j;

    assert((op == 0) || (op == 1) || (op == 2));

    /* fix leafrefs */
    LY_TREE_DFS_BEGIN(node, next, iter) {
        /* the node is target of a leafref */
        if ((iter->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && iter->schema->child) {
            set = (struct ly_set *)iter->schema->child;
            for (i = 0; i < set->number; i++) {
                data = lyd_find_instance(iter, set->set.s[i]);
                if (data) {
                    for (j = 0; j < data->number; j++) {
                        leaf_list = (struct lyd_node_leaf_list *)data->set.d[j];
                        if (((op != 0) && (leaf_list->value_type == LY_TYPE_LEAFREF) && (leaf_list->value.leafref == iter))
                                || ((op != 1) && (leaf_list->value_type & LY_TYPE_LEAFREF_UNRES))) {
                            /* invalidate the leafref, a change concerning it happened */
                            leaf_list->validity |= LYD_VAL_LEAFREF;
                            if (leaf_list->value_type == LY_TYPE_LEAFREF) {
                                /* remove invalid link */
                                leaf_list->value.leafref = NULL;
                            }
                        }
                    }
                    ly_set_free(data);
                } else {
                    LOGINT;
                    return;
                }
            }
        }
        LY_TREE_DFS_END(node, next, iter)
    }

    /* invalidate parent to make sure it will be checked in future validation */
    if (node->parent) {
        node->parent->validity = LYD_VAL_MAND;
    }

    /* update parent's default flag if needed */
    lyd_wd_update_parents(node);
}